

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> __thiscall
kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>>::
attach<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>
          (Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>> *this,
          Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *attachments)

{
  _func_int **pp_Var1;
  Disposer *pDVar2;
  AttachmentPromiseNodeBase *this_00;
  undefined8 *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> PVar3;
  
  pp_Var1 = (_func_int **)*in_RDX;
  pDVar2 = (Disposer *)in_RDX[1];
  in_RDX[1] = 0;
  this_00 = (AttachmentPromiseNodeBase *)operator_new(0x28);
  kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)attachments);
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006208a0;
  this_00[1].super_PromiseNode._vptr_PromiseNode = pp_Var1;
  this_00[1].dependency.disposer = pDVar2;
  *(undefined8 **)this =
       &kj::_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>>
        ::instance;
  *(AttachmentPromiseNodeBase **)(this + 8) = this_00;
  PVar3.super_PromiseBase.node.ptr = extraout_RDX;
  PVar3.super_PromiseBase.node.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>>>
        ::instance;
  return (Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>)
         PVar3.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}